

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

bool __thiscall om::concurrency::queue<int>::dequeue(queue<int> *this,int *item_)

{
  bool bVar1;
  reference pvVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  int *item__local;
  queue<int> *this_local;
  
  lock._M_device = (mutex_type *)item_;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->_mutex);
  bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty(&this->_queue);
  if (!bVar1) {
    pvVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->_queue);
    ((lock._M_device)->super___mutex_base)._M_mutex.__data.__lock = *pvVar2;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->_queue);
  }
  this_local._7_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return this_local._7_1_;
}

Assistant:

bool dequeue(T& item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);

				if(_queue.empty())
					return false;

				item_ = std::move(_queue.front());
				_queue.pop();
				return true;
			}